

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSlowShrinking.cpp
# Opt level: O1

int main(void)

{
  __uniq_ptr_impl<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
  _Var1;
  undefined4 in_stack_ffffffffffffff6c;
  undefined **local_88;
  long *plStack_80;
  ulong local_78;
  Result local_68;
  
  local_88 = (undefined **)0x0;
  plStack_80 = (long *)0x0;
  local_78 = 0;
  _Var1._M_t.
  super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
  .
  super__Head_base<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_false>
  ._M_head_impl =
       (tuple<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
        )operator_new(0x10);
  *(undefined ***)
   _Var1._M_t.
   super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
   .
   super__Head_base<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_false>
   ._M_head_impl = &PTR__GenConcept_0010fbc8;
  local_88 = &PTR_expect_0010fd08;
  cppqc::tupleOf<std::vector<int,std::allocator<int>>>
            ((cppqc *)&plStack_80,
             (Generator<std::vector<int,_std::allocator<int>_>_> *)&stack0xffffffffffffff70);
  if ((_Tuple_impl<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
       )_Var1._M_t.
        super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
        .
        super__Head_base<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_false>
        ._M_head_impl != (GenConcept<std::vector<int,_std::allocator<int>_>_> *)0x0) {
    (**(code **)(*(long *)_Var1._M_t.
                          super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
                          .
                          super__Head_base<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  local_88 = &PTR_expect_0010fb40;
  local_78 = local_78 & 0xffffffffffffff00;
  cppqc::
  quickCheckOutput<std::vector<int,std::allocator<int>>,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type>
            (&local_68,(cppqc *)&local_88,
             (Property<std::vector<int,_std::allocator<int>_>,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
              *)&std::cout,(ostream *)0x64,0,0,CONCAT44(in_stack_ffffffffffffff6c,0xffffffff),
             (duration<double,_std::ratio<1L,_1L>_>)0x403e000000000000,
             (SeedType)
             _Var1._M_t.
             super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
             .
             super__Head_base<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_false>
             ._M_head_impl);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_68.labels._M_t);
  local_88 = &PTR_expect_0010fd08;
  if (plStack_80 != (long *)0x0) {
    (**(code **)(*plStack_80 + 8))();
  }
  return 0;
}

Assistant:

int main() {
  cppqc::quickCheckOutput(PropTestSlowFunction());
}